

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  ModuleField *pMVar1;
  _func_int ***ppp_Var2;
  bool bVar3;
  Result RVar4;
  _Head_base<0UL,_wabt::Import_*,_false> import;
  GlobalModuleField *pGVar5;
  Enum EVar6;
  string name;
  ModuleFieldList export_fields;
  Location loc;
  string local_108;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  size_t local_d8;
  char *pcStack_d0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_c8;
  undefined8 uStack_c0;
  ModuleFieldList local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  undefined8 uStack_80;
  Token local_70;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_70,this);
  local_88.offset = (size_t)local_70.loc.field_1.field_1.offset;
  uStack_80 = local_70.loc.field_1._8_8_;
  local_98 = local_70.loc.filename._M_len;
  uStack_90 = local_70.loc.filename._M_str;
  RVar4 = Expect(this,Global);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_108);
  local_b8.size_ = 0;
  local_b8.first_ = (ModuleField *)0x0;
  local_b8.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,&local_b8,Global);
  EVar6 = Error;
  if (RVar4.enum_ != Error) {
    bVar3 = PeekMatchLpar(this,Import);
    if (bVar3) {
      CheckImportOrdering(this,module);
      import._M_head_impl = (Import *)operator_new(0x98);
      ((import._M_head_impl)->module_name)._M_dataplus._M_p =
           (pointer)&((import._M_head_impl)->module_name).field_2;
      ((import._M_head_impl)->module_name)._M_string_length = 0;
      ((import._M_head_impl)->module_name).field_2._M_local_buf[0] = '\0';
      ((import._M_head_impl)->field_name)._M_dataplus._M_p =
           (pointer)&((import._M_head_impl)->field_name).field_2;
      ((import._M_head_impl)->field_name)._M_string_length = 0;
      ((import._M_head_impl)->field_name).field_2._M_local_buf[0] = '\0';
      (import._M_head_impl)->kind_ = Global;
      (import._M_head_impl)->_vptr_Import = (_func_int **)&PTR__GlobalImport_001e16b0;
      import._M_head_impl[1]._vptr_Import =
           (_func_int **)&import._M_head_impl[1].module_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(import._M_head_impl + 1),local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      *(undefined8 *)((long)&import._M_head_impl[1].module_name.field_2 + 8) = 0xffffffc0;
      *(undefined1 *)&import._M_head_impl[1].field_name._M_dataplus._M_p = 0;
      import._M_head_impl[1].field_name._M_string_length = 0;
      import._M_head_impl[1].field_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&import._M_head_impl[1].field_name.field_2 + 8) = 0;
      RVar4 = ParseInlineImport(this,import._M_head_impl);
      if ((RVar4.enum_ == Error) ||
         (RVar4 = ParseGlobalType(this,(Global *)(import._M_head_impl + 1)), RVar4.enum_ == Error))
      {
        (**(code **)((long)(import._M_head_impl)->_vptr_Import + 8))(import._M_head_impl);
        goto LAB_0015db85;
      }
      GetToken(&local_70,this);
      local_c8.offset = (size_t)local_70.loc.field_1.field_1.offset;
      uStack_c0 = local_70.loc.field_1._8_8_;
      local_d8 = local_70.loc.filename._M_len;
      pcStack_d0 = local_70.loc.filename._M_str;
      local_e0._M_head_impl = (ImportModuleField *)operator_new(0x48);
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001e1448;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename._M_len = local_d8;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename._M_str = pcStack_d0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.field_1.field_1.offset = local_c8.offset;
      *(undefined8 *)
       ((long)&((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
               super_ModuleField.loc.field_1 + 8) = uStack_c0;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      type_ = Import;
      ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_001e15c0;
      ((local_e0._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = import._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_e0);
      if (local_e0._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_e0._M_head_impl = (ImportModuleField *)0x0;
    }
    else {
      pGVar5 = (GlobalModuleField *)operator_new(0x88);
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField._vptr_ModuleField
           = (_func_int **)&PTR__ModuleField_001e1448;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.field_1.
      field_0.line = (int)local_88.offset;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.field_1.
      field_0.first_column = local_88.offset._4_4_;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.field_1.
      field_0.last_column = (int)uStack_80;
      *(undefined4 *)
       ((long)&(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
               field_1 + 0xc) = uStack_80._4_4_;
      *(undefined4 *)
       &(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.filename.
        _M_len = (undefined4)local_98;
      *(undefined4 *)
       ((long)&(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
               filename._M_len + 4) = local_98._4_4_;
      *(undefined4 *)
       &(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.filename.
        _M_str = (undefined4)uStack_90;
      *(undefined4 *)
       ((long)&(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.loc.
               filename._M_str + 4) = uStack_90._4_4_;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.type_ = Global;
      (pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField._vptr_ModuleField
           = (_func_int **)&PTR__GlobalModuleField_001e1840;
      (pGVar5->global).name._M_dataplus._M_p = (pointer)&(pGVar5->global).name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&pGVar5->global,local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      (pGVar5->global).type.enum_ = Void;
      (pGVar5->global).type.type_index_ = 0;
      (pGVar5->global).mutable_ = false;
      (pGVar5->global).init_expr.first_ = (Expr *)0x0;
      (pGVar5->global).init_expr.last_ = (Expr *)0x0;
      (pGVar5->global).init_expr.size_ = 0;
      RVar4 = ParseGlobalType(this,&pGVar5->global);
      if ((RVar4.enum_ == Error) ||
         (RVar4 = ParseTerminatingInstrList(this,&(pGVar5->global).init_expr), RVar4.enum_ == Error)
         ) {
        (*(pGVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
          _vptr_ModuleField[1])(pGVar5);
        goto LAB_0015db85;
      }
      local_e8._M_head_impl = pGVar5;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)&local_e8);
      if (local_e8._M_head_impl != (GlobalModuleField *)0x0) {
        (*((local_e8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_e8._M_head_impl = (GlobalModuleField *)0x0;
    }
    anon_unknown_1::AppendInlineExportFields
              (module,&local_b8,
               (int)((ulong)((long)(module->globals).
                                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(module->globals).
                                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
    RVar4 = Expect(this,Rpar);
    EVar6 = (Enum)(RVar4.enum_ == Error);
  }
LAB_0015db85:
  pMVar1 = local_b8.first_;
  while (pMVar1 != (ModuleField *)0x0) {
    ppp_Var2 = &pMVar1->_vptr_ModuleField;
    pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var2)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}